

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true> *this,
          pair<const_char_*,_llvm::cl::Option_*> *Elt)

{
  undefined8 *puVar1;
  Option *pOVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>)
          .super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    grow(this,0);
    uVar3 = (this->
            super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>).
            super_SmallVectorBase.Size;
  }
  pOVar2 = Elt->second;
  puVar1 = (undefined8 *)
           ((long)(this->
                  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                  ).super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->first;
  puVar1[1] = pOVar2;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->
                    super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                    ).super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }